

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O1

void dtrmv(char uplo,char trans,char diag,int n,double *a,int lda,double *x,int incx)

{
  int iVar1;
  long lVar2;
  char ca;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  int iVar11;
  undefined7 in_register_00000039;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  double dVar18;
  string local_68;
  undefined4 local_48;
  int local_44;
  double *local_40;
  int local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,diag);
  local_40 = a;
  local_38 = lda;
  bVar3 = lsame(uplo,'U');
  if ((bVar3) || (bVar3 = lsame(uplo,'L'), bVar3)) {
    bVar3 = lsame(trans,'N');
    if ((bVar3) || ((bVar3 = lsame(trans,'T'), bVar3 || (bVar3 = lsame(trans,'C'), bVar3)))) {
      ca = (char)local_34;
      bVar3 = lsame((char)local_34,'U');
      if ((bVar3) || (bVar3 = lsame(ca,'N'), bVar3)) {
        if (n < 0) {
          iVar5 = 4;
        }
        else {
          iVar5 = i4_max(1,n);
          if (iVar5 <= local_38) {
            bVar3 = incx != 0;
            iVar5 = (uint)(incx == 0) << 3;
            goto LAB_0021547f;
          }
          iVar5 = 6;
        }
      }
      else {
        iVar5 = 3;
      }
    }
    else {
      iVar5 = 2;
    }
  }
  else {
    iVar5 = 1;
  }
  bVar3 = false;
LAB_0021547f:
  if (bVar3) {
    if (n != 0) {
      local_48 = (undefined4)CONCAT71(in_register_00000039,uplo);
      bVar3 = lsame((char)local_34,'N');
      local_34 = CONCAT31(local_34._1_3_,bVar3);
      local_44 = 0;
      if (incx < 1) {
        local_44 = (1 - n) * incx;
      }
      bVar3 = lsame(trans,'N');
      bVar4 = lsame((char)local_48,'U');
      if (bVar3) {
        if (bVar4) {
          if (incx == 1) {
            if (0 < n) {
              uVar8 = 0;
              pdVar10 = local_40;
              do {
                dVar18 = x[uVar8];
                if ((dVar18 != 0.0) || (NAN(dVar18))) {
                  if (uVar8 != 0) {
                    uVar12 = 0;
                    do {
                      x[uVar12] = pdVar10[uVar12] * dVar18 + x[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar8 != uVar12);
                  }
                  if ((char)local_34 != '\0') {
                    x[uVar8] = x[uVar8] * local_40[(local_38 + 1) * (int)uVar8];
                  }
                }
                uVar8 = uVar8 + 1;
                pdVar10 = pdVar10 + local_38;
              } while (uVar8 != (uint)n);
            }
          }
          else if (0 < n) {
            lVar7 = (long)local_44;
            pdVar10 = x + lVar7;
            uVar8 = 0;
            pdVar13 = local_40;
            do {
              dVar18 = x[lVar7];
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                if (uVar8 != 0) {
                  uVar12 = 0;
                  pdVar17 = pdVar10;
                  do {
                    *pdVar17 = pdVar13[uVar12] * dVar18 + *pdVar17;
                    uVar12 = uVar12 + 1;
                    pdVar17 = pdVar17 + incx;
                  } while (uVar8 != uVar12);
                }
                if ((char)local_34 != '\0') {
                  x[lVar7] = x[lVar7] * local_40[(local_38 + 1) * (int)uVar8];
                }
              }
              lVar7 = lVar7 + incx;
              uVar8 = uVar8 + 1;
              pdVar13 = pdVar13 + local_38;
            } while (uVar8 != (uint)n);
          }
        }
        else if (incx == 1) {
          if (0 < n) {
            lVar6 = (ulong)(uint)n - 1;
            pdVar10 = local_40 + lVar6 * local_38;
            lVar7 = lVar6;
            do {
              dVar18 = x[lVar7];
              lVar14 = lVar6;
              lVar2 = (long)(n + -1);
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                while (lVar7 < lVar2) {
                  x[lVar14] = pdVar10[lVar14] * dVar18 + x[lVar14];
                  lVar14 = lVar14 + -1;
                  lVar2 = lVar14;
                }
                if ((char)local_34 != '\0') {
                  x[lVar7] = x[lVar7] * local_40[(local_38 + 1) * (int)lVar7];
                }
              }
              pdVar10 = pdVar10 + -(long)local_38;
              bVar3 = 0 < lVar7;
              lVar7 = lVar7 + -1;
            } while (bVar3);
          }
        }
        else if (0 < n) {
          iVar5 = n + -1;
          local_44 = local_44 + iVar5 * incx;
          lVar6 = (ulong)(uint)n - 1;
          pdVar10 = local_40 + lVar6 * local_38;
          lVar7 = lVar6;
          iVar11 = local_44;
          do {
            dVar18 = x[iVar11];
            iVar1 = local_44;
            lVar14 = lVar6;
            lVar2 = (long)iVar5;
            if ((dVar18 != 0.0) || (NAN(dVar18))) {
              while (lVar7 < lVar2) {
                x[iVar1] = pdVar10[lVar14] * dVar18 + x[iVar1];
                lVar14 = lVar14 + -1;
                iVar1 = iVar1 - incx;
                lVar2 = lVar14;
              }
              if ((char)local_34 != '\0') {
                x[iVar11] = x[iVar11] * local_40[(local_38 + 1) * (int)lVar7];
              }
            }
            iVar11 = iVar11 - incx;
            pdVar10 = pdVar10 + -(long)local_38;
            bVar3 = 0 < lVar7;
            lVar7 = lVar7 + -1;
          } while (bVar3);
        }
      }
      else if (bVar4) {
        if (incx == 1) {
          if (0 < n) {
            lVar7 = (long)n;
            pdVar10 = local_40 + lVar7 + ((ulong)(uint)n - 1) * (long)local_38 + -2;
            uVar8 = (ulong)(uint)n;
            do {
              lVar7 = lVar7 + -1;
              uVar12 = uVar8 - 1;
              dVar18 = x[uVar8 - 1];
              if ((char)local_34 != '\0') {
                dVar18 = dVar18 * local_40[(local_38 + 1) * (int)uVar12];
              }
              lVar6 = lVar7;
              pdVar13 = pdVar10;
              if (1 < (long)uVar8) {
                do {
                  dVar18 = dVar18 + *pdVar13 * x[lVar6 + -1];
                  lVar14 = lVar6 + -1;
                  bVar3 = 0 < lVar6;
                  lVar6 = lVar14;
                  pdVar13 = pdVar13 + -1;
                } while (lVar14 != 0 && bVar3);
              }
              x[uVar12] = dVar18;
              pdVar10 = pdVar10 + ~(long)local_38;
              bVar3 = 1 < (long)uVar8;
              uVar8 = uVar12;
            } while (bVar3);
          }
        }
        else if (0 < n) {
          iVar5 = (n + -1) * incx + local_44;
          uVar8 = (ulong)(uint)n;
          pdVar10 = local_40 + (uVar8 - 1) * (long)local_38 + (uVar8 - 2);
          local_44 = (n + -2) * incx + local_44;
          do {
            dVar18 = x[iVar5];
            if ((char)local_34 != '\0') {
              dVar18 = dVar18 * local_40[(local_38 + 1) * (int)(uVar8 - 1)];
            }
            if (1 < (long)uVar8) {
              lVar7 = 0;
              iVar11 = local_44;
              do {
                dVar18 = dVar18 + pdVar10[lVar7] * x[iVar11];
                lVar6 = uVar8 + lVar7;
                lVar7 = lVar7 + -1;
                iVar11 = iVar11 - incx;
              } while (1 < lVar6 + -1);
            }
            x[iVar5] = dVar18;
            iVar5 = iVar5 - incx;
            pdVar10 = pdVar10 + ~(long)local_38;
            local_44 = local_44 - incx;
            bVar3 = 1 < (long)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar3);
        }
      }
      else if (incx == 1) {
        if (0 < n) {
          uVar15 = (ulong)(uint)n;
          uVar8 = uVar15;
          pdVar10 = x;
          pdVar13 = local_40;
          uVar12 = 0;
          do {
            dVar18 = x[uVar12];
            if ((char)local_34 != '\0') {
              dVar18 = dVar18 * local_40[(local_38 + 1) * (int)uVar12];
            }
            uVar9 = uVar12 + 1;
            if (uVar9 < uVar15) {
              uVar16 = 1;
              do {
                dVar18 = dVar18 + pdVar13[uVar16] * pdVar10[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar8 != uVar16);
            }
            x[uVar12] = dVar18;
            pdVar13 = pdVar13 + (long)local_38 + 1;
            pdVar10 = pdVar10 + 1;
            uVar8 = uVar8 - 1;
            uVar12 = uVar9;
          } while (uVar9 != uVar15);
        }
      }
      else if (0 < n) {
        lVar7 = (long)local_44;
        lVar6 = (long)incx;
        uVar12 = (ulong)(uint)n;
        pdVar10 = x + lVar7 + lVar6;
        uVar15 = 0;
        uVar8 = uVar12;
        pdVar13 = local_40;
        do {
          dVar18 = x[lVar7];
          if ((char)local_34 != '\0') {
            dVar18 = dVar18 * local_40[(local_38 + 1) * (int)uVar15];
          }
          uVar15 = uVar15 + 1;
          if (uVar15 < uVar12) {
            uVar9 = 1;
            pdVar17 = pdVar10;
            do {
              dVar18 = dVar18 + pdVar13[uVar9] * *pdVar17;
              pdVar17 = pdVar17 + lVar6;
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          x[lVar7] = dVar18;
          lVar7 = lVar7 + lVar6;
          pdVar10 = pdVar10 + lVar6;
          pdVar13 = pdVar13 + (long)local_38 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar15 != uVar12);
      }
    }
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"DTRMV","");
    xerbla(&local_68,iVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void dtrmv ( char uplo, char trans, char diag, int n, double a[], int lda, 
  double x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMV computes x: = A*x or x = A'*x for a triangular matrix A.
//
//  Discussion:
//
//    DTRMV performs one of the matrix-vector operations
//
//      x := A*x,   or   x := A'*x,
//
//    where x is an n element vector and  A is an n by n unit, or non-unit,
//    upper or lower triangular matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char UPLO, specifies whether the matrix is an upper or
//    lower triangular matrix as follows:
//    'u' or 'U': A is an upper triangular matrix.
//    'l' or 'L': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the operation to be performed as
//    follows:
//    'n' or 'N': x := A*x.
//    't' or 'T': x := A'*x.
//    'c' or 'C': x := A'*x.
//
//    Input, char DIAG, specifies whether or not A is unit
//    triangular as follows:
//    'u' or 'U': A is assumed to be unit triangular.
//    'n' or 'N': A is not assumed to be unit triangular.
//
//    Input, int N, the order of the matrix A.
//    0 <= N.
//
//    Input, double A[LDA*N].
//    Before entry with  UPLO = 'u' or 'U', the leading n by n
//    upper triangular part of the array A must contain the upper
//    triangular matrix and the strictly lower triangular part of
//    A is not referenced.
//    Before entry with UPLO = 'l' or 'L', the leading n by n
//    lower triangular part of the array A must contain the lower
//    triangular matrix and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'u' or 'U', the diagonal elements of
//    A are not referenced either, but are assumed to be unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, N ) <= LDA.
//
//    Input/output, double X[1+(N-1)*abs( INCX)].
//    Before entry, the incremented array X must contain the n
//    element vector x. On exit, X is overwritten with the
//    tranformed vector x.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jx;
  int kx = 0;
  bool nounit;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if  ( ! lsame ( uplo, 'U' ) && ! lsame ( uplo, 'L' )  )
  {
    info = 1;
  }
  else if ( ! lsame ( trans, 'N' ) && ! lsame ( trans, 'T' ) && 
            ! lsame ( trans, 'C' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 3;
  }
  else if ( n < 0 )
  {
    info = 4;
  }
  else if ( lda < i4_max ( 1, n ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }

  if ( info != 0 )
  {
    xerbla ( "DTRMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 ) 
  {
    return;
  }

  nounit = lsame ( diag, 'N' );
//
//  Set up the start point in X if the increment is not unity. This
//  will be  ( N - 1 ) * INCX  too small for descending loops.
//
  if ( incx <= 0 )
  {
    kx = 0 - ( n - 1 ) * incx;
  }
  else if ( incx != 1 )
  {
    kx = 0;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( lsame ( trans, 'N' ) )
  {
//
//  Form x := A*x.
//
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = 0; i < j; i++ )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = 0; i < j; i++ )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix + incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx + incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[j] != 0.0 )
          {
            temp = x[j];
            for ( i = n - 1; j < i; i-- )
            {
              x[i] = x[i] + temp * a[i+j*lda];
            }
            if ( nounit )
            {
              x[j] = x[j] * a[j+j*lda];
            }
          }
        }
      }
      else
      {
        kx = kx + ( n - 1 ) * incx;
        jx = kx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( x[jx] != 0.0 )
          {
            temp = x[jx];
            ix = kx;
            for ( i = n - 1; j < i; i-- )
            {
              x[ix] = x[ix] + temp * a[i+j*lda];
              ix = ix - incx;
            }
            if ( nounit )
            {
              x[jx] = x[jx] * a[j+j*lda];
            }
          }
          jx = jx - incx;
        }
      }
    }
  }
//
//  Form x := A'*x.
//
  else
  {
    if ( lsame ( uplo, 'U' ) )
    {
      if ( incx == 1 )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx + ( n - 1 ) * incx;
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j - 1; 0 <= i; i-- )
          {
            ix = ix - incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx - incx;
        }
      }
    }
    else
    {
      if ( incx == 1 )
      {
        for ( j = 0; j < n; j++ )
        {
          temp = x[j];
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            temp = temp + a[i+j*lda] * x[i];
          }
          x[j] = temp;
        }
      }
      else
      {
        jx = kx;
        for ( j = 0; j < n; j++ )
        {
          temp = x[jx];
          ix = jx;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = j + 1; i < n; i++ )
          {
            ix = ix + incx;
            temp = temp + a[i+j*lda] * x[ix];
          }
          x[jx] = temp;
          jx = jx + incx;
        }
      }
    }
  }

  return;
}